

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong helper_extpdp_mips64(target_ulong ac,target_ulong size,CPUMIPSState_conflict5 *env)

{
  target_ulong tVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  target_ulong dspc;
  uint uVar6;
  
  uVar4 = (uint)size & 0x1f;
  uVar5 = (uint)(env->active_tc).DSPControl;
  uVar6 = ~uVar4 + (uVar5 & 0x7f);
  if ((int)uVar6 < -1) {
    uVar5 = uVar5 | 0x4000;
    tVar1 = 0;
  }
  else {
    iVar2 = (uVar5 & 0x7f) - uVar4;
    if ((iVar2 < 0) || (0x40 - iVar2 <= (int)uVar4)) {
      __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                    ,0x158,"uint64_t extract64(uint64_t, int, int)");
    }
    bVar3 = (byte)uVar4 ^ 0x3f;
    tVar1 = ((((ulong)(uint)(env->active_tc).LO[ac] | (env->active_tc).HI[ac] << 0x20) >>
             ((byte)iVar2 & 0x3f)) << bVar3) >> bVar3;
    uVar5 = uVar6 & 0x7f | uVar5 & 0xffffbf80;
  }
  (env->active_tc).DSPControl = (ulong)uVar5;
  return tVar1;
}

Assistant:

target_ulong helper_extpdp(target_ulong ac, target_ulong size,
                           CPUMIPSState *env)
{
    int32_t start_pos;
    int sub;
    uint32_t temp;
    uint64_t acc;

    size = size & 0x1F;
    temp = 0;
    start_pos = get_DSPControl_pos(env);
    sub = start_pos - (size + 1);
    if (sub >= -1) {
        acc  = ((uint64_t)env->active_tc.HI[ac] << 32) |
               ((uint64_t)env->active_tc.LO[ac] & MIPSDSP_LLO);
        temp = extract64(acc, start_pos - size, size + 1);

        set_DSPControl_pos(sub, env);
        set_DSPControl_efi(0, env);
    } else {
        set_DSPControl_efi(1, env);
    }

    return (target_ulong)temp;
}